

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

iterator divsufsortxx::helper::
         median5<divsufsortxx::substring::substring_wrapper<char*,bitmap::BitmapArray<long>::iterator>,bitmap::BitmapArray<long>::iterator>
                   (substring_wrapper<char_*,_bitmap::BitmapArray<long>::iterator> Td,iterator v1,
                   iterator v2,iterator v3,iterator v4,iterator v5)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  pos_type pVar3;
  BitmapArray<long> *pBVar4;
  pos_type pVar5;
  BitmapArray<long> *pBVar6;
  iterator iVar7;
  pos_type local_80;
  pos_type local_78;
  BitmapArray<long> *local_70;
  BitmapArray<long> *local_60;
  BitmapArray<long> *local_50;
  pos_type local_48;
  
  local_60 = v4.array_;
  local_78 = v4.pos_;
  local_48 = v3.pos_;
  local_50 = v3.array_;
  pVar5 = v1.pos_;
  pBVar6 = v1.array_;
  pVar3 = v2.pos_;
  pBVar4 = v2.array_;
  iVar2 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,pVar3);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var,iVar2) + Td.m_PA.pos_);
  cVar1 = Td.m_Td[CONCAT44(extraout_var_00,iVar2)];
  iVar2 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50,local_48);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_01,iVar2) + Td.m_PA.pos_);
  local_80 = pVar3;
  local_70 = pBVar4;
  if (Td.m_Td[CONCAT44(extraout_var_02,iVar2)] < cVar1) {
    local_80 = local_48;
    local_70 = local_50;
    local_50 = pBVar4;
    local_48 = pVar3;
  }
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_03,iVar2) + Td.m_PA.pos_);
  cVar1 = Td.m_Td[CONCAT44(extraout_var_04,iVar2)];
  iVar2 = (*((v5.array_)->super_Bitmap)._vptr_Bitmap[5])(v5.array_,v5.pos_);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_05,iVar2) + Td.m_PA.pos_);
  if (Td.m_Td[CONCAT44(extraout_var_06,iVar2)] < cVar1) {
    v4.array_ = v5.array_;
    v4.pos_ = v5.pos_;
  }
  else {
    local_78 = v5.pos_;
    local_60 = v5.array_;
  }
  iVar2 = (*(local_70->super_Bitmap)._vptr_Bitmap[5])(local_70,local_80);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_07,iVar2) + Td.m_PA.pos_);
  cVar1 = Td.m_Td[CONCAT44(extraout_var_08,iVar2)];
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_09,iVar2) + Td.m_PA.pos_);
  v5.array_ = local_60;
  v5.pos_ = local_78;
  if (Td.m_Td[CONCAT44(extraout_var_10,iVar2)] < cVar1) {
    v4.array_ = local_70;
    v4.pos_ = local_80;
    v5.array_ = local_50;
    v5.pos_ = local_48;
    local_48 = local_78;
    local_50 = local_60;
  }
  iVar2 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,pVar5);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,Td.m_PA.pos_ + CONCAT44(extraout_var_11,iVar2));
  cVar1 = Td.m_Td[CONCAT44(extraout_var_12,iVar2)];
  iVar2 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50,local_48);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_13,iVar2) + Td.m_PA.pos_);
  pBVar4 = pBVar6;
  pVar3 = pVar5;
  local_80 = local_48;
  if (Td.m_Td[CONCAT44(extraout_var_14,iVar2)] < cVar1) {
    pBVar4 = local_50;
    pVar3 = local_48;
    local_50 = pBVar6;
    local_80 = pVar5;
  }
  iVar2 = (*(pBVar4->super_Bitmap)._vptr_Bitmap[5])(pBVar4,pVar3);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_15,iVar2) + Td.m_PA.pos_);
  cVar1 = Td.m_Td[CONCAT44(extraout_var_16,iVar2)];
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,Td.m_PA.pos_ + CONCAT44(extraout_var_17,iVar2));
  if (Td.m_Td[CONCAT44(extraout_var_18,iVar2)] < cVar1) {
    local_80 = v5.pos_;
    local_50 = v5.array_;
    v4.array_ = pBVar4;
    v4.pos_ = pVar3;
  }
  iVar2 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,CONCAT44(extraout_var_19,iVar2) + Td.m_PA.pos_);
  cVar1 = Td.m_Td[CONCAT44(extraout_var_20,iVar2)];
  iVar2 = (*((v4.array_)->super_Bitmap)._vptr_Bitmap[5])(v4.array_,v4.pos_);
  iVar2 = (*((Td.m_PA.array_)->super_Bitmap)._vptr_Bitmap[5])
                    (Td.m_PA.array_,Td.m_PA.pos_ + CONCAT44(extraout_var_21,iVar2));
  if (Td.m_Td[CONCAT44(extraout_var_22,iVar2)] < cVar1) {
    local_50 = v4.array_;
    local_80 = v4.pos_;
  }
  iVar7.pos_ = local_80;
  iVar7.array_ = local_50;
  return iVar7;
}

Assistant:

SAIterator_type median5(const StringIterator_type Td, SAIterator_type v1,
                        SAIterator_type v2, SAIterator_type v3,
                        SAIterator_type v4, SAIterator_type v5) {
  if (Td[*v2] > Td[*v3]) {
    std::swap(v2, v3);
  }
  if (Td[*v4] > Td[*v5]) {
    std::swap(v4, v5);
  }
  if (Td[*v2] > Td[*v4]) {
    std::swap(v2, v4);
    std::swap(v3, v5);
  }
  if (Td[*v1] > Td[*v3]) {
    std::swap(v1, v3);
  }
  if (Td[*v1] > Td[*v4]) {
    std::swap(v1, v4);
    std::swap(v3, v5);
  }
  if (Td[*v3] > Td[*v4]) {
    return v4;
  }
  return v3;
}